

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O2

void __thiscall MeasurementToString_simple_Test::TestBody(MeasurementToString_simple_Test *this)

{
  precise_measurement *measure;
  measurement *measure_00;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertHelper local_68;
  string local_60;
  measurement meas;
  precise_measurement pm;
  
  pm.value_ = (double)&DAT_4046800000000000;
  pm.units_.multiplier_ = (double)0x3ff0000000000000;
  pm.units_.base_units_ = (unit_data)0x1;
  pm.units_.commodity_ = 0;
  measure = (precise_measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_60;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&pm,measure,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&meas,"to_string(pm)","\"45 m\"",__return_storage_ptr__,
             (char (*) [5])"45 m");
  std::__cxx11::string::~string((string *)&local_60);
  if (meas.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_60);
    if (meas.units_ == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)meas.units_;
    }
    __return_storage_ptr__ = (string *)0x49;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&meas.units_);
  meas.value_ = (double)&DAT_4046800000000000;
  meas.units_.multiplier_ = 1.0;
  meas.units_.base_units_ = (unit_data)0x1;
  measure_00 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_60,(units *)&meas,measure_00,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&gtest_ar_1,"to_string(meas)","\"45 m\"",&local_60,(char (*) [5])"45 m");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(MeasurementToString, simple)
{
    auto pm = precise_measurement(45.0, precise::m);
    EXPECT_EQ(to_string(pm), "45 m");
    auto meas = 45.0 * m;
    EXPECT_EQ(to_string(meas), "45 m");
}